

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

void __thiscall dlib::thread_pool_implementation::thread(thread_pool_implementation *this)

{
  member_function_pointer<void,_void,_void,_void> *item;
  bfp_type *this_00;
  bool bVar1;
  size_t sVar2;
  task_state_type *ptVar3;
  void *pvVar4;
  char cVar5;
  void *__tmp;
  uint64 *puVar6;
  size_t sVar7;
  size_t sVar8;
  pthread_mutex_t *__mutex;
  int iVar9;
  bool bVar10;
  exception_ptr eptr;
  thread_id_type id;
  task_state_type task;
  auto_mutex local_210;
  pthread_mutex_t *local_1f8;
  pthread_cond_t *local_1f0;
  bound_function_pointer *local_1e8;
  mfp_kernel_1_base_class<2UL> *local_1e0;
  mutex *local_1d8;
  uint64 uStack_1d0;
  thread_id_type tStack_1c8;
  uint64 uStack_1c0;
  long lStack_1b8;
  long lStack_1b0;
  mfp_kernel_1_base_class<0UL> local_1a8;
  mfp_kernel_1_base_class<1UL> local_168;
  mfp_kernel_1_base_class<2UL> local_128;
  bound_function_pointer bStack_e8;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  exception_ptr local_48;
  
  __mutex = (pthread_mutex_t *)&this->m;
  uStack_1d0 = 0;
  tStack_1c8 = 0;
  local_1d8 = (mutex *)__mutex;
  pthread_mutex_lock(__mutex);
  local_210.m = (mutex *)pthread_self();
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
            (&this->worker_thread_ids,(unsigned_long *)&local_210);
  auto_mutex::unlock((auto_mutex *)&local_1d8);
  task_state_type::task_state_type((task_state_type *)&local_1d8);
  if (this->we_are_destructing != false) {
LAB_001a5a05:
    if (local_48._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
    (*(code *)**bStack_e8.bf_memory.data)();
    (*(code *)**local_128.mp_memory.data)();
    (*(code *)**local_168.mp_memory.data)();
    (*(code *)**local_1a8.mp_memory.data)();
    return;
  }
  local_1e0 = &local_128;
  local_1e8 = &bStack_e8;
  local_1f0 = (pthread_cond_t *)&(this->task_done_signaler).cond;
  local_1f8 = __mutex;
LAB_001a5aa2:
  local_210.r = (rmutex *)0x0;
  local_210.rw = (read_write_mutex *)0x0;
  local_210.m = (mutex *)__mutex;
  pthread_mutex_lock(__mutex);
  do {
    sVar2 = (this->tasks).array_size;
    sVar8 = 0xffffffffffffffff;
    if (sVar2 != 0) {
      puVar6 = &((this->tasks).array_elements)->task_id;
      sVar7 = 0;
      do {
        if ((((task_state_type *)(puVar6 + -1))->is_being_processed == false) &&
           (sVar8 = sVar7, *puVar6 != 0)) break;
        sVar7 = sVar7 + 1;
        puVar6 = puVar6 + 0x34;
        sVar8 = 0xffffffffffffffff;
      } while (sVar2 != sVar7);
    }
    bVar1 = this->we_are_destructing;
    if ((sVar8 != 0xffffffffffffffff) || (bVar1 != false)) break;
    pthread_cond_wait((pthread_cond_t *)&(this->task_ready_signaler).cond,
                      (pthread_mutex_t *)(this->task_ready_signaler).associated_mutex);
  } while( true );
  iVar9 = 3;
  if ((bVar1 & 1U) == 0) {
    ptVar3 = (this->tasks).array_elements;
    item = &ptVar3[sVar8].mfp0;
    *(undefined1 *)((long)(item + -1) + 0x10) = 1;
    lStack_1b8 = *(long *)((long)(item + -1) + 0x30);
    lStack_1b0 = *(long *)((long)(item + -1) + 0x38);
    local_1d8 = *(mutex **)((long)(item + -1) + 0x10);
    uStack_1d0 = *(uint64 *)((long)(item + -1) + 0x18);
    tStack_1c8 = *(thread_id_type *)((long)(item + -1) + 0x20);
    uStack_1c0 = *(uint64 *)((long)(item + -1) + 0x28);
    mfp_kernel_1_base_class<0UL>::operator=(&local_1a8,&item->super_mfp_kernel_1_base_class<0UL>);
    mfp_kernel_1_base_class<1UL>::operator=
              (&local_168,&ptVar3[sVar8].mfp1.super_mfp_kernel_1_base_class<1UL>);
    mfp_kernel_1_base_class<2UL>::operator=
              (local_1e0,&ptVar3[sVar8].mfp2.super_mfp_kernel_1_base_class<2UL>);
    bound_function_pointer::operator=(local_1e8,&ptVar3[sVar8].bfp);
    local_58 = ptVar3[sVar8].function_copy.
               super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_50,
               &ptVar3[sVar8].function_copy.
                super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pvVar4 = ptVar3[sVar8].eptr._M_exception_object;
    if (pvVar4 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    __mutex = local_1f8;
    bVar10 = local_48._M_exception_object != (void *)0x0;
    local_48._M_exception_object = pvVar4;
    if (bVar10) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    iVar9 = 0;
  }
  auto_mutex::unlock(&local_210);
  if ((bVar1 & 1U) == 0) {
    cVar5 = (**(code **)(*bStack_e8.bf_memory.data + 0x18))();
    if (cVar5 == '\0') {
      if (*(long *)((long)local_1a8.mp_memory.data + 8) == 0) {
        if (*(long *)((long)local_168.mp_memory.data + 8) == 0) {
          if (*(long *)((long)local_128.mp_memory.data + 8) != 0) {
            (**(code **)(*local_128.mp_memory.data + 0x20))
                      (local_128.mp_memory.data,lStack_1b8,lStack_1b0);
          }
        }
        else {
          (**(code **)(*local_168.mp_memory.data + 0x20))(local_168.mp_memory.data,lStack_1b8);
        }
      }
      else {
        (**(code **)(*local_1a8.mp_memory.data + 0x20))();
      }
    }
    else {
      (**(code **)(*bStack_e8.bf_memory.data + 0x10))();
    }
    local_210.r = (rmutex *)0x0;
    local_210.rw = (read_write_mutex *)0x0;
    local_210.m = (mutex *)__mutex;
    pthread_mutex_lock(__mutex);
    this_00 = &(this->tasks).array_elements[sVar8].bfp;
    *(undefined1 *)((long)(this_00 + -2) + 0x30) = 0;
    *(undefined8 *)((long)(this_00 + -2) + 0x38) = 0;
    bound_function_pointer::clear(this_00);
    mfp_kernel_1_base_class<0UL>::clear
              (&(this->tasks).array_elements[sVar8].mfp0.super_mfp_kernel_1_base_class<0UL>);
    mfp_kernel_1_base_class<1UL>::clear
              (&(this->tasks).array_elements[sVar8].mfp1.super_mfp_kernel_1_base_class<1UL>);
    mfp_kernel_1_base_class<2UL>::clear
              (&(this->tasks).array_elements[sVar8].mfp2.super_mfp_kernel_1_base_class<2UL>);
    ptVar3 = (this->tasks).array_elements;
    ptVar3[sVar8].arg1 = 0;
    (&ptVar3[sVar8].arg1)[1] = 0;
    pvVar4 = ptVar3[sVar8].eptr._M_exception_object;
    ptVar3[sVar8].eptr._M_exception_object = (void *)0x0;
    if (pvVar4 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    pthread_cond_broadcast(local_1f0);
    auto_mutex::unlock(&local_210);
    iVar9 = 0;
  }
  if ((iVar9 != 0) || (this->we_are_destructing != false)) goto LAB_001a5a05;
  goto LAB_001a5aa2;
}

Assistant:

void thread_pool_implementation::
    thread (
    )
    {
        {
            // save the id of this worker thread into worker_thread_ids
            auto_mutex M(m);
            thread_id_type id = get_thread_id();
            worker_thread_ids.push_back(id);
        }

        task_state_type task;
        while (we_are_destructing == false)
        {
            long idx = 0;

            // wait for a task to do 
            { auto_mutex M(m);
                while ( (idx = find_ready_task()) == -1 && we_are_destructing == false)
                    task_ready_signaler.wait();

                if (we_are_destructing)
                    break;

                tasks[idx].is_being_processed = true;
                task = tasks[idx];
            }

            std::exception_ptr eptr = nullptr;
            try
            {
                // now do the task
                if (task.bfp)
                    task.bfp();
                else if (task.mfp0)
                    task.mfp0();
                else if (task.mfp1)
                    task.mfp1(task.arg1);
                else if (task.mfp2)
                    task.mfp2(task.arg1, task.arg2);
            }
            catch(...)
            {
                eptr = std::current_exception();
            }

            // Now let others know that we finished the task.  We do this
            // by clearing out the state of this task
            { auto_mutex M(m);
                tasks[idx].is_being_processed = false;
                tasks[idx].task_id = 0;
                tasks[idx].bfp.clear();
                tasks[idx].mfp0.clear();
                tasks[idx].mfp1.clear();
                tasks[idx].mfp2.clear();
                tasks[idx].arg1 = 0;
                tasks[idx].arg2 = 0;
                tasks[idx].eptr = eptr;
                task_done_signaler.broadcast();
            }

        }
    }